

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

Ref __thiscall cashew::ValueBuilder::makeUnary(ValueBuilder *this,IString op,Ref value)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  void *pvVar4;
  
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = cashew::Value::setArray(pVVar2,3);
  pvVar4 = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar3.inst)->type = Null;
  cashew::Value::free(RVar3.inst,pvVar4);
  (RVar3.inst)->type = String;
  pcVar1 = DAT_010b13f0;
  ((RVar3.inst)->field_1).str.str._M_len = UNARY_PREFIX;
  ((RVar3.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = cashew::Value::push_back(pVVar2,RVar3);
  pvVar4 = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar3.inst)->type = Null;
  cashew::Value::free(RVar3.inst,pvVar4);
  (RVar3.inst)->type = String;
  ((RVar3.inst)->field_1).arr = (ArrayStorage *)this;
  ((RVar3.inst)->field_1).str.str._M_str = (char *)op.str._M_len;
  pVVar2 = cashew::Value::push_back(pVVar2,RVar3);
  RVar3.inst = cashew::Value::push_back(pVVar2,(Value *)op.str._M_str);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makeUnary(IString op, Ref value) {
    return &makeRawArray(3)
              ->push_back(makeRawString(UNARY_PREFIX))
              .push_back(makeRawString(op))
              .push_back(value);
  }